

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spell.c
# Opt level: O1

boolean confused_book(obj *spellbook)

{
  uint uVar1;
  boolean bVar2;
  char *pcVar3;
  
  uVar1 = mt_random();
  if ((uVar1 * -0x55555555 < 0x55555556) && (spellbook->otyp != 0x1bd)) {
    spellbook->field_0x4c = spellbook->field_0x4c | 0x80;
    pline("Being confused you have difficulties in controlling your actions.");
    (*windowprocs.win_pause)(P_MESSAGE);
    pline("You accidentally tear the spellbook to pieces.");
    if (((objects[spellbook->otyp].field_0x10 & 1) == 0) &&
       (objects[spellbook->otyp].oc_uname == (char *)0x0)) {
      docall(spellbook);
    }
    useup(spellbook);
    bVar2 = '\x01';
  }
  else {
    pcVar3 = "first";
    if (book == spellbook) {
      pcVar3 = "next";
    }
    bVar2 = '\0';
    pline("You find yourself reading the %s line over and over again.",pcVar3);
  }
  return bVar2;
}

Assistant:

static boolean confused_book(struct obj *spellbook)
{
	boolean gone = FALSE;

	if (!rn2(3) && spellbook->otyp != SPE_BOOK_OF_THE_DEAD) {
	    spellbook->in_use = TRUE;	/* in case called from learn */
	    pline(
	"Being confused you have difficulties in controlling your actions.");
	    win_pause_output(P_MESSAGE);
	    pline("You accidentally tear the spellbook to pieces.");
	    if (!objects[spellbook->otyp].oc_name_known &&
		!objects[spellbook->otyp].oc_uname)
		docall(spellbook);
	    useup(spellbook);
	    gone = TRUE;
	} else {
	    pline("You find yourself reading the %s line over and over again.",
		spellbook == book ? "next" : "first");
	}
	return gone;
}